

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall GEO::Delaunay3d::nearest_vertex(Delaunay3d *this,double *p)

{
  bool bVar1;
  index_t t_00;
  index_t i;
  double *p2;
  double dVar2;
  double cur_sq_dist;
  uint local_38;
  signed_index_t v;
  index_t lv;
  index_t result;
  double sq_dist;
  index_t t;
  double *p_local;
  Delaunay3d *this_local;
  
  if ((this->weighted_ & 1U) == 0) {
    bVar1 = Delaunay::thread_safe(&this->super_Delaunay);
    t_00 = locate(this,p,0xffffffff,bVar1,(Sign *)0x0);
    if ((t_00 == 0xffffffff) || (bVar1 = tet_is_virtual(this,t_00), bVar1)) {
      this_local._4_4_ = Delaunay::nearest_vertex(&this->super_Delaunay,p);
    }
    else {
      _lv = 1e+30;
      v = -1;
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        i = tet_vertex(this,t_00,local_38);
        if (-1 < (int)i) {
          p2 = Delaunay::vertex_ptr(&this->super_Delaunay,i);
          dVar2 = Geom::distance2<double>(p,p2,'\x03');
          if (dVar2 < _lv) {
            v = i;
            _lv = dVar2;
          }
        }
      }
      this_local._4_4_ = v;
    }
  }
  else {
    this_local._4_4_ = Delaunay::nearest_vertex(&this->super_Delaunay,p);
  }
  return this_local._4_4_;
}

Assistant:

index_t Delaunay3d::nearest_vertex(const double* p) const {

        // TODO: For the moment, we fallback to the (unefficient)
        // baseclass implementation when in weighted mode.
        if(weighted_) {
            return Delaunay::nearest_vertex(p);
        }

        // Find a tetrahedron (real or virtual) that contains p
        index_t t = locate(p, NO_TETRAHEDRON, thread_safe());

        //   If p is outside the convex hull of the inserted points,
        // a special traversal is required (not implemented yet).
        // TODO: implement convex hull boundary traversal
        // (for now we fallback to linear search implemented
        //  in baseclass)
        if(t == NO_TETRAHEDRON || tet_is_virtual(t)) {
            return Delaunay::nearest_vertex(p);
        }

        double sq_dist = 1e30;
        index_t result = NO_TETRAHEDRON;

        // Find the nearest vertex among t's vertices
        for(index_t lv = 0; lv < 4; ++lv) {
            signed_index_t v = tet_vertex(t, lv);
            // If the tetrahedron is virtual, then the first vertex
            // is the vertex at infinity and is skipped.
            if(v < 0) {
                continue;
            }
            double cur_sq_dist = Geom::distance2(p, vertex_ptr(index_t(v)), 3);
            if(cur_sq_dist < sq_dist) {
                sq_dist = cur_sq_dist;
                result = index_t(v);
            }
        }
        return result;
    }